

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

void __thiscall zmq::message_t::message_t<int_const*>(message_t *this,int *first,int *last)

{
  int iVar1;
  difference_type dVar2;
  error_t *this_00;
  int *__result;
  int rc;
  size_t size_;
  int *last_local;
  int *first_local;
  message_t *this_local;
  
  dVar2 = std::distance<int_const*>(first,last);
  if (dVar2 < 0) {
    __assert_fail("std::distance(first, last) >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq.hpp",0x1ad,
                  "zmq::message_t::message_t(ForwardIter, ForwardIter) [ForwardIter = const int *]")
    ;
  }
  dVar2 = std::distance<int_const*>(first,last);
  iVar1 = zmq_msg_init_size(this,dVar2 << 2);
  if (iVar1 != 0) {
    this_00 = (error_t *)__cxa_allocate_exception(0x10);
    error_t::error_t(this_00);
    __cxa_throw(this_00,&error_t::typeinfo,error_t::~error_t);
  }
  __result = data<int>(this);
  std::copy<int_const*,int*>(first,last,__result);
  return;
}

Assistant:

message_t(ForwardIter first, ForwardIter last)
    {
        typedef typename std::iterator_traits<ForwardIter>::value_type value_t;

        assert(std::distance(first, last) >= 0);
        size_t const size_ =
          static_cast<size_t>(std::distance(first, last)) * sizeof(value_t);
        int const rc = zmq_msg_init_size(&msg, size_);
        if (rc != 0)
            throw error_t();
        std::copy(first, last, data<value_t>());
    }